

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O2

void __thiscall
Gluco::Heap<Gluco::Solver::VarOrderLt>::decrease(Heap<Gluco::Solver::VarOrderLt> *this,int n)

{
  double dVar1;
  int iVar2;
  vec<double> *pvVar3;
  int *piVar4;
  int *piVar5;
  double *pdVar6;
  int iVar7;
  int iVar8;
  
  if (n < (this->indices).sz) {
    iVar7 = (this->indices).data[n];
    if (-1 < iVar7) {
      pvVar3 = (this->lt).activity;
      piVar4 = (this->heap).data;
      iVar2 = piVar4[iVar7];
      piVar5 = (this->indices).data;
      while( true ) {
        if (iVar7 == 0) break;
        iVar8 = iVar7 + -1 >> 1;
        pdVar6 = pvVar3->data;
        dVar1 = pdVar6[iVar2];
        pdVar6 = pdVar6 + piVar4[iVar8];
        if (dVar1 < *pdVar6 || dVar1 == *pdVar6) break;
        piVar4[iVar7] = piVar4[iVar8];
        piVar5[piVar4[iVar8]] = iVar7;
        iVar7 = iVar8;
      }
      piVar4[iVar7] = iVar2;
      piVar5[iVar2] = iVar7;
      return;
    }
  }
  __assert_fail("inHeap(n)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/Heap.h"
                ,0x56,
                "void Gluco::Heap<Gluco::Solver::VarOrderLt>::decrease(int) [Comp = Gluco::Solver::VarOrderLt]"
               );
}

Assistant:

bool inHeap    (int n)     const { return n < indices.size() && indices[n] >= 0; }